

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

int __thiscall ncnn::MultiHeadAttention::load_param(MultiHeadAttention *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,1);
  *(int *)(in_RDI + 0xd4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,0);
  *(int *)(in_RDI + 0xd8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,*(int *)(in_RDI + 0xd0));
  *(int *)(in_RDI + 0xdc) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,*(int *)(in_RDI + 0xd0));
  *(int *)(in_RDI + 0xe0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,5,0);
  *(int *)(in_RDI + 0xe4) = iVar1;
  return 0;
}

Assistant:

int MultiHeadAttention::load_param(const ParamDict& pd)
{
    embed_dim = pd.get(0, 0);
    num_heads = pd.get(1, 1);
    weight_data_size = pd.get(2, 0);
    kdim = pd.get(3, embed_dim);
    vdim = pd.get(4, embed_dim);
    attn_mask = pd.get(5, 0);

    return 0;
}